

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * spvtools::opt::anon_unknown_15::RemoveOneNodeFromMultiplyChain
                   (SEMultiplyNode *mul,SENode *node)

{
  value_type pSVar1;
  int iVar2;
  ChildContainerType *pCVar3;
  reference ppSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SENode *pSVar5;
  ScalarEvolutionAnalysis *pSVar6;
  SENode *pSVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SENode *res_1;
  SENode *res;
  SENode *rhs;
  SENode *lhs;
  SENode *node_local;
  SEMultiplyNode *mul_local;
  
  pCVar3 = SENode::GetChildren(&mul->super_SENode);
  ppSVar4 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::
            operator[](pCVar3,0);
  pSVar1 = *ppSVar4;
  pCVar3 = SENode::GetChildren(&mul->super_SENode);
  ppSVar4 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::
            operator[](pCVar3,1);
  pSVar7 = *ppSVar4;
  mul_local = (SEMultiplyNode *)pSVar7;
  if ((pSVar1 != node) && (mul_local = (SEMultiplyNode *)pSVar1, pSVar7 != node)) {
    iVar2 = (*pSVar1->_vptr_SENode[10])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      iVar2 = (*pSVar1->_vptr_SENode[10])();
      pSVar5 = RemoveOneNodeFromMultiplyChain
                         ((SEMultiplyNode *)CONCAT44(extraout_var_00,iVar2),node);
      if (pSVar5 != pSVar1) {
        pSVar6 = SENode::GetParentAnalysis(&mul->super_SENode);
        pSVar7 = ScalarEvolutionAnalysis::CreateMultiplyNode(pSVar6,pSVar5,pSVar7);
        return pSVar7;
      }
    }
    iVar2 = (*pSVar7->_vptr_SENode[10])();
    mul_local = mul;
    if (CONCAT44(extraout_var_01,iVar2) != 0) {
      iVar2 = (*pSVar7->_vptr_SENode[10])();
      pSVar5 = RemoveOneNodeFromMultiplyChain
                         ((SEMultiplyNode *)CONCAT44(extraout_var_02,iVar2),node);
      mul_local = mul;
      if (pSVar5 != pSVar7) {
        pSVar6 = SENode::GetParentAnalysis(&mul->super_SENode);
        mul_local = (SEMultiplyNode *)
                    ScalarEvolutionAnalysis::CreateMultiplyNode(pSVar6,pSVar5,pSVar7);
      }
    }
  }
  return &mul_local->super_SENode;
}

Assistant:

SENode* RemoveOneNodeFromMultiplyChain(SEMultiplyNode* mul,
                                       const SENode* node) {
  SENode* lhs = mul->GetChildren()[0];
  SENode* rhs = mul->GetChildren()[1];
  if (lhs == node) {
    return rhs;
  }
  if (rhs == node) {
    return lhs;
  }
  if (lhs->AsSEMultiplyNode()) {
    SENode* res = RemoveOneNodeFromMultiplyChain(lhs->AsSEMultiplyNode(), node);
    if (res != lhs)
      return mul->GetParentAnalysis()->CreateMultiplyNode(res, rhs);
  }
  if (rhs->AsSEMultiplyNode()) {
    SENode* res = RemoveOneNodeFromMultiplyChain(rhs->AsSEMultiplyNode(), node);
    if (res != rhs)
      return mul->GetParentAnalysis()->CreateMultiplyNode(res, rhs);
  }

  return mul;
}